

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

bool_t derTIsValid(u32 tag)

{
  u32 b;
  u32 t;
  u32 tag_local;
  
  if (tag == 0) {
    return 0;
  }
  if (tag < 0x100) {
    if ((tag & 0x1f) == 0x1f) {
      return 0;
    }
  }
  else {
    if ((tag & 0x80) != 0) {
      return 0;
    }
    b = tag & 0x7f;
    t = b;
    for (tag_local = tag >> 8; 0xff < tag_local; tag_local = tag_local >> 8) {
      if (((tag_local & 0x80) == 0) || (t >> 0x19 != 0)) {
        return 0;
      }
      b = tag_local & 0x7f;
      t = b | t << 7;
    }
    if (((t < 0x1f) || (b == 0)) || ((tag_local & 0x1f) != 0x1f)) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static bool_t derTIsValid(u32 tag)
{
	if (tag == 0)
		return FALSE;
	else if (tag < 256)
	{
		// установлены 5 младших битов?
		if ((tag & 31) == 31)
			return FALSE;
	}
	// длинный код
	else
	{
		u32 t;
		u32 b;
		// установлен старший бит в последнем (младшем) октете?
		if (tag & 128)
			return FALSE;
		// пробегаем ненулевые октеты вплоть до первого (старшего)
		for (b = tag & 127, t = b, tag >>= 8; tag > 255; tag >>= 8)
		{
			// в промежуточном октете снят старший бит?
			// будет переполнение при пересчете тега-как-значения?
			if ((tag & 128) == 0 || (t >> 25) != 0)
				return FALSE;
			// пересчитать тег-как-значение
			b = tag & 127, t = t << 7, t |= b;
		}
		// можно кодировать одним октетом? меньшим числом октетов?
		// в первом (старшем) октете не установлены 5 младших битов?
		if (t < 31 || b == 0 || (tag & 31) != 31)
			return FALSE;
	}
	return TRUE;
}